

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sha.c
# Opt level: O3

int ndn_sha256_sign(uint8_t *input_value,uint32_t input_size,uint8_t *output_value,
                   uint32_t output_max_size,uint32_t *output_used_size)

{
  int iVar1;
  int iVar2;
  
  iVar1 = -10;
  if (0x1f < output_max_size) {
    iVar2 = ndn_sha256(input_value,input_size,output_value);
    iVar1 = 0x20;
    if (iVar2 == 0) {
      *output_used_size = 0x20;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
ndn_sha256_sign(const uint8_t* input_value, uint32_t input_size,
                uint8_t* output_value, uint32_t output_max_size,
                uint32_t* output_used_size)
{
  if (output_max_size < NDN_SEC_SHA256_HASH_SIZE)
    return NDN_OVERSIZE;
  if (ndn_sha256(input_value, input_size, output_value) != NDN_SUCCESS) {
    return NDN_SEC_SHA256_HASH_SIZE;
  }
  *output_used_size = NDN_SEC_SHA256_HASH_SIZE;
  return NDN_SUCCESS;
}